

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O2

int run_test_fs_file_nametoolong(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  uv_fs_t req;
  char name [65537];
  
  ::loop = (uv_loop_t *)uv_default_loop();
  memset(name,0x61,0x10000);
  iVar1 = uv_fs_open(0,&req,name,0,0,0);
  if (iVar1 == -0x24) {
    if (req.result == -0x24) {
      uv_fs_req_cleanup(&req);
      iVar1 = uv_fs_open(::loop,&req,name,0,0,open_nametoolong_cb);
      if (iVar1 == 0) {
        if (open_cb_count == 0) {
          uv_run(::loop,0);
          if (open_cb_count == 1) {
            loop = (uv_loop_t *)uv_default_loop();
            close_loop(loop);
            uVar2 = uv_default_loop();
            iVar1 = uv_loop_close(uVar2);
            if (iVar1 == 0) {
              return 0;
            }
            pcVar3 = "0 == uv_loop_close(uv_default_loop())";
            uVar2 = 0x2fa;
          }
          else {
            pcVar3 = "open_cb_count == 1";
            uVar2 = 0x2f8;
          }
        }
        else {
          pcVar3 = "open_cb_count == 0";
          uVar2 = 0x2f6;
        }
      }
      else {
        pcVar3 = "r == 0";
        uVar2 = 0x2f4;
      }
    }
    else {
      pcVar3 = "req.result == UV_ENAMETOOLONG";
      uVar2 = 0x2f0;
    }
  }
  else {
    pcVar3 = "r == UV_ENAMETOOLONG";
    uVar2 = 0x2ef;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(fs_file_nametoolong) {
  uv_fs_t req;
  int r;
  char name[TOO_LONG_NAME_LENGTH + 1];

  loop = uv_default_loop();

  memset(name, 'a', TOO_LONG_NAME_LENGTH);
  name[TOO_LONG_NAME_LENGTH] = 0;

  r = uv_fs_open(NULL, &req, name, O_RDONLY, 0, NULL);
  ASSERT(r == UV_ENAMETOOLONG);
  ASSERT(req.result == UV_ENAMETOOLONG);
  uv_fs_req_cleanup(&req);

  r = uv_fs_open(loop, &req, name, O_RDONLY, 0, open_nametoolong_cb);
  ASSERT(r == 0);

  ASSERT(open_cb_count == 0);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(open_cb_count == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}